

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int Fax3VGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined2 uVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined8 *puVar7;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
    __assert_fail("sp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_fax3.c"
                  ,0x51d,"int Fax3VGetField(TIFF *, uint32_t, struct __va_list_tag *)");
  }
  if ((int)tag < 0x148) {
    if (tag - 0x124 < 2) {
      uVar6 = *(undefined4 *)(puVar3 + 0x20);
    }
    else {
      if (tag != 0x146) {
        if (tag == 0x147) {
          uVar1 = *(undefined2 *)(puVar3 + 0x14);
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar7 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            puVar7 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar7 + 1;
          }
          *(undefined2 *)*puVar7 = uVar1;
          return 1;
        }
LAB_00299062:
        iVar5 = (**(code **)(puVar3 + 0x28))();
        return iVar5;
      }
      uVar6 = *(undefined4 *)(puVar3 + 0x1c);
    }
  }
  else if (tag == 0x148) {
    uVar6 = *(undefined4 *)(puVar3 + 0x18);
  }
  else {
    if (tag == 0x10004) {
      uVar4 = *(undefined8 *)(puVar3 + 0x58);
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar7 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        puVar7 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar7 + 1;
      }
      *(undefined8 *)*puVar7 = uVar4;
      return 1;
    }
    if (tag != 0x10000) goto LAB_00299062;
    uVar6 = *(undefined4 *)(puVar3 + 4);
  }
  uVar2 = ap->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    puVar7 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
    ap->gp_offset = uVar2 + 8;
  }
  else {
    puVar7 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar7 + 1;
  }
  *(undefined4 *)*puVar7 = uVar6;
  return 1;
}

Assistant:

static int Fax3VGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    Fax3BaseState *sp = Fax3State(tif);

    assert(sp != 0);

    switch (tag)
    {
        case TIFFTAG_FAXMODE:
            *va_arg(ap, int *) = sp->mode;
            break;
        case TIFFTAG_FAXFILLFUNC:
            *va_arg(ap, TIFFFaxFillFunc *) = DecoderState(tif)->fill;
            break;
        case TIFFTAG_GROUP3OPTIONS:
        case TIFFTAG_GROUP4OPTIONS:
            *va_arg(ap, uint32_t *) = sp->groupoptions;
            break;
        case TIFFTAG_BADFAXLINES:
            *va_arg(ap, uint32_t *) = sp->badfaxlines;
            break;
        case TIFFTAG_CLEANFAXDATA:
            *va_arg(ap, uint16_t *) = sp->cleanfaxdata;
            break;
        case TIFFTAG_CONSECUTIVEBADFAXLINES:
            *va_arg(ap, uint32_t *) = sp->badfaxrun;
            break;
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return (1);
}